

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O1

void __thiscall
ValidationSignals::ValidationSignals
          (ValidationSignals *this,
          unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
          task_runner)

{
  _Head_base<0UL,_ValidationSignalsImpl_*,_false> this_00;
  pointer *__ptr;
  long in_FS_OFFSET;
  long *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl = (ValidationSignalsImpl *)operator_new(0x80);
  local_28 = *(long **)task_runner._M_t.
                       super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                       .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl;
  *(undefined8 *)
   task_runner._M_t.
   super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
   ._M_t.
   super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
   .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl = 0;
  ValidationSignalsImpl::ValidationSignalsImpl
            (this_00._M_head_impl,
             (unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
             )&local_28);
  (this->m_internals)._M_t.
  super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>._M_t.
  super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>.
  super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl = this_00._M_head_impl;
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ValidationSignals::ValidationSignals(std::unique_ptr<util::TaskRunnerInterface> task_runner)
    : m_internals{std::make_unique<ValidationSignalsImpl>(std::move(task_runner))} {}